

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

bool __thiscall
Rml::DataViewCommon::Initialize
          (DataViewCommon *this,DataModel *model,Element *element,String *expression_str,
          String *in_modifier)

{
  pointer pcVar1;
  bool bVar2;
  DataExpression *this_00;
  pointer __p;
  DataExpressionInterface expr_interface;
  String local_50;
  
  if ((this->modifier)._M_string_length == 0) {
    ::std::__cxx11::string::_M_assign((string *)&this->modifier);
  }
  this_00 = (DataExpression *)operator_new(0x50);
  pcVar1 = (expression_str->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + expression_str->_M_string_length);
  DataExpression::DataExpression(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)0x0;
  ::std::__uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::reset
            ((__uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)
             &this->expression,this_00);
  ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::~unique_ptr
            ((unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)&local_50
            );
  DataExpressionInterface::DataExpressionInterface
            ((DataExpressionInterface *)&local_50,model,element,(Event *)0x0);
  bVar2 = DataExpression::Parse
                    ((this->expression)._M_t.
                     super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                     .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl,
                     (DataExpressionInterface *)&local_50,false);
  return bVar2;
}

Assistant:

bool DataViewCommon::Initialize(DataModel& model, Element* element, const String& expression_str, const String& in_modifier)
{
	// The modifier can be overriden in the constructor
	if (modifier.empty())
		modifier = in_modifier;

	expression = MakeUnique<DataExpression>(expression_str);
	DataExpressionInterface expr_interface(&model, element);

	bool result = expression->Parse(expr_interface, false);
	return result;
}